

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_wsi_txc_check_skint(lws_tx_credit *txc,int32_t tx_cr)

{
  int iVar1;
  char *format;
  uint8_t uVar2;
  
  if (txc->tx_cr < 1) {
    iVar1 = 1;
    uVar2 = '\x01';
    if (txc->skint != '\0') goto LAB_00116176;
    format = "%s: %p: skint (%d)\n";
    uVar2 = '\x01';
  }
  else {
    uVar2 = '\0';
    if (txc->skint == '\0') {
      iVar1 = 0;
      goto LAB_00116176;
    }
    format = "%s: %p: unskint (%d)\n";
    iVar1 = 0;
    uVar2 = '\0';
  }
  _lws_log(8,format,"lws_wsi_txc_check_skint",txc);
LAB_00116176:
  txc->skint = uVar2;
  return iVar1;
}

Assistant:

int
lws_wsi_txc_check_skint(struct lws_tx_credit *txc, int32_t tx_cr)
{
	if (txc->tx_cr <= 0) {
		/*
		 * If other side is not able to cope with us sending any DATA
		 * so no matter if we have POLLOUT on our side if it's DATA we
		 * want to send.
		 */

		if (!txc->skint)
			lwsl_info("%s: %p: skint (%d)\n", __func__, txc,
				  (int)txc->tx_cr);

		txc->skint = 1;

		return 1;
	}

	if (txc->skint)
		lwsl_info("%s: %p: unskint (%d)\n", __func__, txc,
			  (int)txc->tx_cr);

	txc->skint = 0;

	return 0;
}